

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

uint64_t __thiscall obx::Transaction::getDataSizeCommitted(Transaction *this)

{
  obx_err err;
  OBX_txn *pOVar1;
  uint64_t local_18;
  uint64_t size;
  Transaction *this_local;
  
  local_18 = 0;
  size = (uint64_t)this;
  pOVar1 = cPtr(this);
  err = obx_txn_data_size(pOVar1,&local_18,0);
  internal::checkErrOrThrow(err);
  return local_18;
}

Assistant:

uint64_t Transaction::getDataSizeCommitted() const {
    uint64_t size = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), &size, nullptr));
    return size;
}